

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_sort_helper(secp256k1_pubkey *pk,size_t *pk_order,size_t n_pk)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  uchar *p1;
  secp256k1_scalar *message;
  secp256k1_scalar *extraout_RDX;
  secp256k1_scalar *sigr;
  secp256k1_scalar *psVar5;
  secp256k1_scalar *seckey;
  secp256k1_scalar *sigs;
  int *recid;
  secp256k1_pubkey *pk_test [5];
  secp256k1_scalar sStack_88;
  size_t sStack_68;
  long local_38 [5];
  
  if (n_pk != 0) {
    sVar4 = 0;
    do {
      local_38[sVar4] = (long)(pk + pk_order[sVar4]);
      sVar4 = sVar4 + 1;
    } while (n_pk != sVar4);
  }
  secp256k1_hsort(local_38,n_pk,8,secp256k1_ec_pubkey_sort_cmp,CTX);
  if (n_pk != 0) {
    sVar4 = 0;
    psVar5 = extraout_RDX;
    do {
      message = (secp256k1_scalar *)local_38[sVar4];
      sigs = (secp256k1_scalar *)0x0;
      sigr = psVar5;
      do {
        sigr = (secp256k1_scalar *)((ulong)sigr & 0xffffffff);
        bVar1 = *(byte *)((long)sigs->d + (long)message->d);
        recid = (int *)(ulong)bVar1;
        bVar2 = *(uchar *)((long)sigs->d + (long)pk->data);
        psVar5 = (secp256k1_scalar *)(ulong)((uint)bVar1 - (uint)bVar2);
        if (bVar1 != bVar2) goto LAB_0016de83;
        sigs = (secp256k1_scalar *)((long)sigs->d + 1);
      } while (sigs != (secp256k1_scalar *)0x40);
      psVar5 = (secp256k1_scalar *)0x0;
LAB_0016de83:
      if ((int)psVar5 != 0) {
        test_sort_helper_cold_1();
        sStack_68 = n_pk;
        do {
          testutil_random_scalar_order_test(&sStack_88);
          iVar3 = secp256k1_ecdsa_sig_sign
                            (&CTX->ecmult_gen_ctx,sigr,sigs,seckey,message,&sStack_88,recid);
        } while (iVar3 == 0);
        return;
      }
      sVar4 = sVar4 + 1;
      pk = pk + 1;
    } while (sVar4 != n_pk);
  }
  return;
}

Assistant:

static void test_sort_helper(secp256k1_pubkey *pk, size_t *pk_order, size_t n_pk) {
    size_t i;
    const secp256k1_pubkey *pk_test[5];

    for (i = 0; i < n_pk; i++) {
        pk_test[i] = &pk[pk_order[i]];
    }
    secp256k1_ec_pubkey_sort(CTX, pk_test, n_pk);
    for (i = 0; i < n_pk; i++) {
        CHECK(secp256k1_memcmp_var(pk_test[i], &pk[i], sizeof(*pk_test[i])) == 0);
    }
}